

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Echo.cpp
# Opt level: O2

void __thiscall helics::apps::Echo::runTo(Echo *this,Time stopTime_input)

{
  char cVar1;
  element_type *peVar2;
  Time TVar3;
  
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  cVar1 = (char)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]
                [(long)&(peVar2->super_ValueFederate).vfManager._M_t];
  if (cVar1 == '\0') {
    (*(this->super_App)._vptr_App[2])(this);
  }
  else if ('\x01' < cVar1) {
    if (cVar1 == '\x03') {
      return;
    }
    goto LAB_002307b6;
  }
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Federate::enterExecutingMode
            ((Federate *)
             ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
             (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]),NO_ITERATIONS);
LAB_002307b6:
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  TVar3.internalTimeCode =
       *(baseType *)
        (&(peVar2->super_ValueFederate).field_0x28 +
        (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]);
  while (TVar3.internalTimeCode < stopTime_input.internalTimeCode) {
    peVar2 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    TVar3 = Federate::requestTime
                      ((Federate *)
                       ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
                       (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]),stopTime_input);
  }
  return;
}

Assistant:

void Echo::runTo(Time stopTime_input)
    {
        auto md = fed->getCurrentMode();
        if (md == Federate::Modes::STARTUP) {
            initialize();
        }
        if (md < Federate::Modes::EXECUTING) {
            fed->enterExecutingMode();
        } else if (md == Federate::Modes::FINALIZE) {
            return;
        }
        auto ctime = fed->getCurrentTime();
        while (ctime < stopTime_input) {
            ctime = fed->requestTime(stopTime_input);
        }
    }